

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::compose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,UBool doCompose,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  ushort norm16_00;
  void *pvVar3;
  UBool UVar4;
  byte bVar5;
  UChar32 c_00;
  uint uVar6;
  int iVar7;
  int32_t recomposeStartIndex_00;
  UChar *pUVar8;
  uint16_t *puVar9;
  UChar *pUVar10;
  int local_e8;
  int local_e4;
  int local_d4;
  ReorderingBuffer *local_c8;
  int32_t recomposeStartIndex;
  uint16_t __c2_1;
  UChar *pUStack_98;
  int32_t __index_1;
  UChar *p;
  int local_88;
  uint16_t __c2;
  int32_t __index;
  uint8_t prevCC;
  uint16_t n16;
  UChar *nextSrc;
  uint8_t cc;
  UChar32 syllable_1;
  UChar32 syllable;
  int32_t t;
  UChar l;
  UChar prev;
  int32_t length;
  UChar *mapping;
  UChar c2;
  uint16_t norm16;
  UChar32 c;
  UChar *prevSrc;
  UChar *pUStack_40;
  UChar32 minNoMaybeCP;
  UChar *prevBoundary;
  ReorderingBuffer *buffer_local;
  UBool doCompose_local;
  UChar *pUStack_28;
  UBool onlyContiguous_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  UVar1 = this->minCompNoMaybeCP;
  pUVar10 = src;
  pUStack_28 = limit;
  pUStack_40 = src;
  if (limit == (UChar *)0x0) {
    local_c8 = buffer;
    if (doCompose == '\0') {
      local_c8 = (ReorderingBuffer *)0x0;
    }
    pUVar8 = copyLowPrefixFromNulTerminated(this,src,(uint)(ushort)UVar1,local_c8,errorCode);
    UVar4 = ::U_FAILURE(*errorCode);
    if (UVar4 != '\0') {
      return '\0';
    }
    pUStack_28 = u_strchr_63(pUVar8,L'\0');
    pUVar10 = pUVar8;
    pUStack_40 = src;
    if ((src != pUVar8) &&
       (UVar4 = hasCompBoundaryAfter(this,(uint)(ushort)pUVar8[-1],onlyContiguous),
       pUStack_40 = pUVar8, UVar4 == '\0')) {
      ReorderingBuffer::removeSuffix(buffer,1);
      pUVar10 = pUVar8 + -1;
      pUStack_40 = pUVar8 + -1;
    }
  }
LAB_00335c6f:
  do {
    limit_local = pUVar10;
    pUVar8 = limit_local;
    if (limit_local == pUStack_28) {
      if ((pUStack_40 != pUStack_28) && (doCompose != '\0')) {
        ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUStack_28,errorCode);
      }
      return '\x01';
    }
    mapping._4_4_ = (uint)(ushort)*limit_local;
    if ((ushort)UVar1 <= mapping._4_4_) {
      mapping._2_2_ =
           *(uint16_t *)
            ((long)(this->normTrie->data).ptr0 +
            (long)(int)((uint)this->normTrie->index[(int)mapping._4_4_ >> 6] +
                       (mapping._4_4_ & 0x3f)) * 2);
      UVar4 = isCompYesAndZeroCC(this,mapping._2_2_);
      if (UVar4 == '\0') {
        pUVar10 = limit_local + 1;
        _c2 = limit_local;
        if ((mapping._4_4_ & 0xfffffc00) == 0xd800) {
          if ((pUVar10 == pUStack_28) || ((*pUVar10 & 0xfc00U) != 0xdc00)) goto LAB_00335c6f;
          mapping._4_4_ = mapping._4_4_ * 0x400 + (uint)(ushort)*pUVar10 + 0xfca02400;
          pvVar3 = (this->normTrie->data).ptr0;
          if ((int)mapping._4_4_ < this->normTrie->highStart) {
            local_d4 = ucptrie_internalSmallIndex_63(this->normTrie,mapping._4_4_);
          }
          else {
            local_d4 = this->normTrie->dataLength + -2;
          }
          mapping._2_2_ = *(uint16_t *)((long)pvVar3 + (long)local_d4 * 2);
          UVar4 = isCompYesAndZeroCC(this,mapping._2_2_);
          pUVar10 = limit_local + 2;
          if (UVar4 != '\0') goto LAB_00335c6f;
        }
        limit_local = pUVar10;
        UVar4 = isMaybeOrNonZeroCC(this,mapping._2_2_);
        pUVar10 = limit_local;
        if (UVar4 == '\0') {
          if (doCompose == '\0') {
            return '\0';
          }
          UVar4 = isDecompNoAlgorithmic(this,mapping._2_2_);
          if (UVar4 == '\0') {
            if (mapping._2_2_ < this->minNoNoCompBoundaryBefore) {
              UVar4 = norm16HasCompBoundaryAfter(this,mapping._2_2_,onlyContiguous);
              if ((UVar4 != '\0') ||
                 (UVar4 = hasCompBoundaryBefore(this,limit_local,pUStack_28), UVar4 != '\0')) {
                if ((pUStack_40 != pUVar8) &&
                   (UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUVar8,errorCode),
                   UVar4 == '\0')) {
                  return '\x01';
                }
                puVar9 = getMapping(this,mapping._2_2_);
                UVar4 = ReorderingBuffer::appendZeroCC
                                  (buffer,(UChar *)(puVar9 + 1),
                                   (UChar *)(puVar9 + 1 + (int)(*puVar9 & 0x1f)),errorCode);
                if (UVar4 == '\0') {
                  return '\x01';
                }
                pUStack_40 = limit_local;
                goto LAB_00335c6f;
              }
            }
            else if ((this->minNoNoEmpty <= mapping._2_2_) &&
                    ((UVar4 = hasCompBoundaryBefore(this,limit_local,pUStack_28), UVar4 != '\0' ||
                     (UVar4 = hasCompBoundaryAfter(this,pUStack_40,pUVar8,onlyContiguous),
                     UVar4 != '\0')))) {
              if ((pUStack_40 != pUVar8) &&
                 (UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUVar8,errorCode),
                 UVar4 == '\0')) {
                return '\x01';
              }
              pUStack_40 = limit_local;
              goto LAB_00335c6f;
            }
          }
          else {
            UVar4 = norm16HasCompBoundaryAfter(this,mapping._2_2_,onlyContiguous);
            if ((UVar4 != '\0') ||
               (UVar4 = hasCompBoundaryBefore(this,limit_local,pUStack_28), UVar4 != '\0')) {
              if ((pUStack_40 != pUVar8) &&
                 (UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUVar8,errorCode),
                 UVar4 == '\0')) {
                return '\x01';
              }
              c_00 = mapAlgorithmic(this,mapping._4_4_,mapping._2_2_);
              UVar4 = ReorderingBuffer::append(buffer,c_00,'\0',errorCode);
              if (UVar4 == '\0') {
                return '\x01';
              }
              pUStack_40 = limit_local;
              goto LAB_00335c6f;
            }
          }
        }
        else {
          UVar4 = isJamoVT(mapping._2_2_);
          if ((UVar4 == '\0') || (pUStack_40 == pUVar8)) {
            if (0xfe00 < mapping._2_2_) {
              nextSrc._3_1_ = getCCFromNormalYesOrMaybe(mapping._2_2_);
              if ((onlyContiguous == '\0') ||
                 (bVar5 = getPreviousTrailCC(this,pUStack_40,pUVar8), bVar5 <= nextSrc._3_1_)) {
                while( true ) {
                  if (limit_local == pUStack_28) {
                    if (doCompose != '\0') {
                      ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUStack_28,errorCode);
                    }
                    return '\x01';
                  }
                  ___index = limit_local + 1;
                  uVar6 = (uint)(ushort)*limit_local;
                  if ((uVar6 & 0xfffff800) == 0xd800) {
                    if ((((*limit_local & 0x400U) == 0) && (___index != pUStack_28)) &&
                       (UVar2 = *___index, (UVar2 & 0xfc00U) == 0xdc00)) {
                      ___index = limit_local + 2;
                      iVar7 = uVar6 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
                      if (iVar7 < this->normTrie->highStart) {
                        local_e4 = ucptrie_internalSmallIndex_63(this->normTrie,iVar7);
                      }
                      else {
                        local_e4 = this->normTrie->dataLength + -2;
                      }
                      local_88 = local_e4;
                    }
                    else {
                      local_88 = this->normTrie->dataLength + -1;
                    }
                  }
                  else {
                    local_88 = (uint)this->normTrie->index[(int)uVar6 >> 6] + (uVar6 & 0x3f);
                  }
                  norm16_00 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)local_88 * 2);
                  if (norm16_00 < 0xfe02) goto LAB_00336435;
                  bVar5 = getCCFromNormalYesOrMaybe(norm16_00);
                  if (bVar5 < nextSrc._3_1_) break;
                  limit_local = ___index;
                  nextSrc._3_1_ = bVar5;
                }
                if (doCompose == '\0') {
                  return '\0';
                }
LAB_00336435:
                UVar4 = norm16HasCompBoundaryBefore(this,norm16_00);
                if (UVar4 != '\0') {
                  UVar4 = isCompYesAndZeroCC(this,norm16_00);
                  pUVar10 = limit_local;
                  if (UVar4 != '\0') {
                    limit_local = ___index;
                    pUVar10 = limit_local;
                  }
                  goto LAB_00335c6f;
                }
              }
              else if (doCompose == '\0') {
                return '\0';
              }
            }
          }
          else {
            UVar2 = pUVar8[-1];
            if ((int)mapping._4_4_ < 0x11a7) {
              if ((ushort)(UVar2 + L'\xef00') < 0x13) {
                if (doCompose == '\0') {
                  return '\0';
                }
                if (((limit_local == pUStack_28) ||
                    (syllable_1 = (ushort)*limit_local - 0x11a7, syllable_1 < 1)) ||
                   (0x1b < syllable_1)) {
                  UVar4 = hasCompBoundaryBefore(this,limit_local,pUStack_28);
                  if (UVar4 == '\0') {
                    syllable_1 = -1;
                  }
                  else {
                    syllable_1 = 0;
                  }
                }
                else {
                  limit_local = limit_local + 1;
                }
                if (-1 < syllable_1) {
                  if ((pUStack_40 != pUVar8 + -1) &&
                     (UVar4 = ReorderingBuffer::appendZeroCC
                                        (buffer,pUStack_40,pUVar8 + -1,errorCode), UVar4 == '\0')) {
                    return '\x01';
                  }
                  UVar4 = ReorderingBuffer::appendBMP
                                    (buffer,((UVar2 + L'\xef00') * 0x15 +
                                            (short)mapping._4_4_ + -0x1161) * 0x1c + -0x5400 +
                                            (short)syllable_1,'\0',errorCode);
                  if (UVar4 == '\0') {
                    return '\x01';
                  }
                  pUStack_40 = limit_local;
                  pUVar10 = limit_local;
                  goto LAB_00335c6f;
                }
              }
            }
            else {
              UVar4 = Hangul::isHangulLV((uint)(ushort)UVar2);
              if (UVar4 != '\0') {
                if (doCompose == '\0') {
                  return '\0';
                }
                if ((pUStack_40 != pUVar8 + -1) &&
                   (UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUStack_40,pUVar8 + -1,errorCode),
                   UVar4 == '\0')) {
                  return '\x01';
                }
                UVar4 = ReorderingBuffer::appendBMP
                                  (buffer,UVar2 + (short)mapping._4_4_ + L'\xee59','\0',errorCode);
                if (UVar4 == '\0') {
                  return '\x01';
                }
                pUStack_40 = limit_local;
                goto LAB_00335c6f;
              }
            }
          }
        }
        if ((pUStack_40 != pUVar8) &&
           (UVar4 = norm16HasCompBoundaryBefore(this,mapping._2_2_), UVar4 == '\0')) {
          pUStack_98 = pUVar8 + -1;
          uVar6 = (uint)(ushort)pUVar8[-1];
          if ((uVar6 & 0xfffff800) == 0xd800) {
            if ((((pUVar8[-1] & 0x400U) == 0) || (pUStack_98 == pUStack_40)) ||
               ((pUVar8[-2] & 0xfc00U) != 0xd800)) {
              recomposeStartIndex = this->normTrie->dataLength + -1;
            }
            else {
              pUStack_98 = pUVar8 + -2;
              iVar7 = (uint)(ushort)pUVar8[-2] * 0x400 + uVar6 + -0x35fdc00;
              if (iVar7 < this->normTrie->highStart) {
                local_e8 = ucptrie_internalSmallIndex_63(this->normTrie,iVar7);
              }
              else {
                local_e8 = this->normTrie->dataLength + -2;
              }
              recomposeStartIndex = local_e8;
            }
          }
          else {
            recomposeStartIndex = (uint)this->normTrie->index[(int)uVar6 >> 6] + (uVar6 & 0x3f);
          }
          UVar4 = norm16HasCompBoundaryAfter
                            (this,*(uint16_t *)
                                   ((long)(this->normTrie->data).ptr0 +
                                   (long)recomposeStartIndex * 2),onlyContiguous);
          if (UVar4 == '\0') {
            _c2 = pUStack_98;
          }
        }
        if (((doCompose == '\0') || (pUStack_40 == _c2)) ||
           (UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUStack_40,_c2,errorCode), UVar4 != '\0'))
        {
          recomposeStartIndex_00 = ReorderingBuffer::length(buffer);
          decomposeShort(this,_c2,limit_local,'\0',onlyContiguous,buffer,errorCode);
          pUStack_40 = decomposeShort(this,limit_local,pUStack_28,'\x01',onlyContiguous,buffer,
                                      errorCode);
          UVar4 = ::U_FAILURE(*errorCode);
          if (UVar4 == '\0') {
            if (0x7fffffff < (long)pUStack_40 - (long)_c2 >> 1) {
              *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              return '\x01';
            }
            recompose(this,buffer,recomposeStartIndex_00,onlyContiguous);
            pUVar10 = pUStack_40;
            if (doCompose == '\0') {
              UVar4 = ReorderingBuffer::equals(buffer,_c2,pUStack_40);
              if (UVar4 == '\0') {
                return '\0';
              }
              ReorderingBuffer::remove(buffer,(char *)_c2);
            }
            goto LAB_00335c6f;
          }
        }
        return '\x01';
      }
    }
    pUVar10 = limit_local + 1;
  } while( true );
}

Assistant:

UBool
Normalizer2Impl::compose(const UChar *src, const UChar *limit,
                         UBool onlyContiguous,
                         UBool doCompose,
                         ReorderingBuffer &buffer,
                         UErrorCode &errorCode) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP,
                                           doCompose ? &buffer : NULL,
                                           errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                buffer.removeSuffix(1);
                prevBoundary = --src;
            }
        }
    }

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && doCompose) {
                    buffer.appendZeroCC(prevBoundary, limit, errorCode);
                }
                return TRUE;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (!doCompose) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    if(!buffer.append(mapAlgorithmic(c, norm16), 0, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    const UChar *mapping = reinterpret_cast<const UChar *>(getMapping(norm16));
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if(!buffer.appendZeroCC(mapping, mapping + length, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16) && prevBoundary != prevSrc) {
            UChar prev=*(prevSrc-1);
            if(c<Hangul::JAMO_T_BASE) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar l = (UChar)(prev-Hangul::JAMO_L_BASE);
                if(l<Hangul::JAMO_L_COUNT) {
                    if (!doCompose) {
                        return FALSE;
                    }
                    int32_t t;
                    if (src != limit &&
                            0 < (t = ((int32_t)*src - Hangul::JAMO_T_BASE)) &&
                            t < Hangul::JAMO_T_COUNT) {
                        // The next character is a Jamo T.
                        ++src;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    } else {
                        t = -1;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (c-Hangul::JAMO_V_BASE)) *
                            Hangul::JAMO_T_COUNT + t;
                        --prevSrc;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                            break;
                        }
                        if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                            break;
                        }
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (!doCompose) {
                    return FALSE;
                }
                UChar32 syllable = prev + c - Hangul::JAMO_T_BASE;
                --prevSrc;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                    break;
                }
                if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                    break;
                }
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (!doCompose) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (doCompose) {
                            buffer.appendZeroCC(prevBoundary, limit, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (!doCompose) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const UChar *p = prevSrc;
            UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        if (doCompose && prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
            break;
        }
        int32_t recomposeStartIndex=buffer.length();
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, recomposeStartIndex, onlyContiguous);
        if(!doCompose) {
            if(!buffer.equals(prevSrc, src)) {
                return FALSE;
            }
            buffer.remove();
        }
        prevBoundary=src;
    }
    return TRUE;
}